

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_reflect_construct(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  undefined8 in_RAX;
  JSValue *argv_00;
  ulong uVar1;
  JSValueUnion JVar3;
  ulong uVar4;
  JSValue JVar5;
  JSValue new_target;
  uint32_t len;
  int64_t iVar2;
  
  len = (uint32_t)((ulong)in_RAX >> 0x20);
  JVar3 = (JSValueUnion)(argv->u).ptr;
  iVar2 = argv->tag;
  JVar5 = *argv;
  if ((argc < 3) ||
     ((iVar2 = argv[2].tag, (int)iVar2 == -1 &&
      (JVar3 = (JSValueUnion)argv[2].u.ptr, (*(byte *)((long)JVar3.ptr + 5) & 0x10) != 0)))) {
    argv_00 = build_arg_list(ctx,&len,argv[1]);
    if (argv_00 != (JSValue *)0x0) {
      new_target.tag = iVar2;
      new_target.u.float64 = JVar3.float64;
      JVar5 = JS_CallConstructorInternal(ctx,JVar5,new_target,len,argv_00,2);
      iVar2 = JVar5.tag;
      free_arg_list(ctx,argv_00,len);
      uVar1 = (ulong)JVar5.u.ptr & 0xffffffff00000000;
      uVar4 = (ulong)JVar5.u.ptr & 0xffffffff;
      goto LAB_0016966b;
    }
  }
  else {
    JS_ThrowTypeError(ctx,"not a constructor");
  }
  uVar4 = 0;
  iVar2 = 6;
  uVar1 = 0;
LAB_0016966b:
  JVar5.tag = iVar2;
  JVar5.u.ptr = (void *)(uVar4 | uVar1);
  return JVar5;
}

Assistant:

static JSValue js_reflect_construct(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSValueConst func, array_arg, new_target;
    JSValue *tab, ret;
    uint32_t len;

    func = argv[0];
    array_arg = argv[1];
    if (argc > 2) {
        new_target = argv[2];
        if (!JS_IsConstructor(ctx, new_target))
            return JS_ThrowTypeError(ctx, "not a constructor");
    } else {
        new_target = func;
    }
    tab = build_arg_list(ctx, &len, array_arg);
    if (!tab)
        return JS_EXCEPTION;
    ret = JS_CallConstructor2(ctx, func, new_target, len, (JSValueConst *)tab);
    free_arg_list(ctx, tab, len);
    return ret;
}